

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyDebugNames
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData)

{
  uint32_t uVar1;
  DWARFObject *pDVar2;
  char *__n;
  DWARFContext *this_00;
  DWARFUnit *this_01;
  pointer pDVar3;
  Header *pHVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  raw_ostream *prVar10;
  NameIndex *NI_00;
  size_t __n_00;
  Error *E_00;
  void *__buf;
  DataExtractor *extraout_RDX;
  DataExtractor *StrData_00;
  DataExtractor *extraout_RDX_00;
  DWARFDebugInfoEntry *Die;
  long lVar11;
  NameIndex *pNVar12;
  pointer pDVar13;
  undefined1 in_R8B;
  uint32_t Index;
  NameIndex *NI;
  bool bVar14;
  StringRef Str;
  DWARFDebugNames local_100;
  undefined1 local_90 [8];
  NameTableEntry NTE;
  ulong local_50;
  NameIndex *local_48;
  _func_int **local_40;
  Error E;
  
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar5 = (*pDVar2->_vptr_DWARFObject[5])(pDVar2);
  local_100.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Data =
       (AccelSection->Data).Data;
  local_100.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Length =
       (AccelSection->Data).Length;
  local_100.super_DWARFAcceleratorTable.StringSection.IsLittleEndian = StrData->IsLittleEndian;
  local_100.super_DWARFAcceleratorTable.StringSection.AddressSize = StrData->AddressSize;
  local_100.super_DWARFAcceleratorTable.StringSection._18_6_ = *(undefined6 *)&StrData->field_0x12;
  local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.
  BeginX = &local_100.CUToNameIndex;
  local_100.super_DWARFAcceleratorTable.StringSection.Data.Data = (StrData->Data).Data;
  local_100.super_DWARFAcceleratorTable.StringSection.Data.Length = (StrData->Data).Length;
  local_100.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.IsLittleEndian =
       (uint8_t)iVar5;
  local_100.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.AddressSize = '\0';
  NTE.EntryOffset = (uint64_t)&PTR__DWARFDebugNames_00d77758;
  local_100.super_DWARFAcceleratorTable._vptr_DWARFAcceleratorTable =
       (_func_int **)&PTR__DWARFDebugNames_00d77758;
  local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.Size
       = 0;
  local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.
  Capacity = 0;
  local_100.CUToNameIndex.Buckets._0_4_ = 0;
  local_100.CUToNameIndex.Buckets._4_4_ = 0;
  local_100.CUToNameIndex.NumEntries = 0;
  local_100.CUToNameIndex.NumTombstones = 0;
  local_100.CUToNameIndex.NumBuckets = 0;
  Str.Length = 0x1a;
  Str.Data = "Verifying .debug_names...\n";
  local_100.super_DWARFAcceleratorTable.AccelSection.Obj = pDVar2;
  local_100.super_DWARFAcceleratorTable.AccelSection.Section = AccelSection;
  E.Payload = (ErrorInfoBase *)this;
  raw_ostream::operator<<(this->OS,Str);
  DWARFDebugNames::extract((DWARFDebugNames *)&stack0xffffffffffffffc0);
  uVar9 = (ulong)local_40 & 0xfffffffffffffffe;
  local_40 = (_func_int **)(uVar9 != 0 | uVar9);
  if (uVar9 == 0) {
    uVar6 = verifyDebugNamesCULists((DWARFVerifier *)E.Payload,&local_100);
    if ((local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
         super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
         super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
         super_SmallVectorBase._8_8_ & 0xffffffff) != 0) {
      lVar11 = (local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                super_SmallVectorBase._8_8_ & 0xffffffff) * 0x98;
      StrData_00 = extraout_RDX;
      pNVar12 = (NameIndex *)
                local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                super_SmallVectorBase.BeginX;
      do {
        uVar7 = verifyNameIndexBuckets((DWARFVerifier *)E.Payload,pNVar12,StrData_00);
        uVar6 = uVar6 + uVar7;
        pNVar12 = pNVar12 + 1;
        lVar11 = lVar11 + -0x98;
        StrData_00 = extraout_RDX_00;
      } while (lVar11 != 0);
      if ((local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff) != 0) {
        lVar11 = (local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                  super_SmallVectorBase._8_8_ & 0xffffffff) * 0x98;
        pNVar12 = (NameIndex *)
                  local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                  super_SmallVectorBase.BeginX;
        do {
          uVar7 = verifyNameIndexAbbrevs((DWARFVerifier *)E.Payload,pNVar12);
          uVar6 = uVar6 + uVar7;
          pNVar12 = pNVar12 + 1;
          lVar11 = lVar11 + -0x98;
        } while (lVar11 != 0);
      }
    }
    if (uVar6 == 0) {
      if ((local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff) != 0) {
        local_48 = (NameIndex *)
                   ((long)local_100.NameIndices.
                          super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                          super_SmallVectorBase.BeginX +
                   (local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                    super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                    super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                    super_SmallVectorBase._8_8_ & 0xffffffff) * 0x98);
        uVar6 = 0;
        pNVar12 = (NameIndex *)
                  local_100.NameIndices.super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                  super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                  super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                  super_SmallVectorBase.BeginX;
        do {
          uVar1 = (pNVar12->Hdr).super_HeaderPOD.NameCount;
          if (uVar1 != 0) {
            Index = 1;
            do {
              DWARFDebugNames::NameIndex::getNameTableEntry
                        ((NameTableEntry *)local_90,pNVar12,Index);
              uVar7 = verifyNameIndexEntries
                                ((DWARFVerifier *)E.Payload,pNVar12,(NameTableEntry *)local_90);
              if ((pNVar12->Hdr).super_HeaderPOD.NameCount < Index) {
                __assert_fail("CurrentName <= CurrentIndex->getNameCount()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFAcceleratorTable.h"
                              ,0x218,"void llvm::DWARFDebugNames::NameIterator::next()");
              }
              uVar6 = uVar6 + uVar7;
              bVar14 = Index != uVar1;
              Index = Index + 1;
            } while (bVar14);
          }
          pNVar12 = pNVar12 + 1;
        } while (pNVar12 != local_48);
        if (uVar6 != 0) goto LAB_00b10b2e;
      }
      this_00 = (DWARFContext *)E.Payload[1]._vptr_ErrorInfoBase;
      DWARFContext::parseNormalUnits(this_00);
      uVar7 = (this_00->NormalUnits).NumInfoUnits;
      if (uVar7 == 0xffffffff) {
        uVar7 = (this_00->NormalUnits).
                super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                .
                super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                .
                super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                .super_SmallVectorBase.Size;
      }
      if (uVar7 == 0) {
        uVar6 = 0;
      }
      else {
        pNVar12 = (NameIndex *)
                  (this_00->NormalUnits).
                  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                  .
                  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                  .
                  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                  .
                  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                  .super_SmallVectorBase.BeginX;
        pHVar4 = &pNVar12->Hdr;
        uVar6 = 0;
        do {
          NI_00 = DWARFDebugNames::getCUNameIndex
                            (&local_100,
                             (uint64_t)
                             (((pNVar12->Abbrevs).
                               super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                               .TheMap.Buckets)->key).Attributes.
                             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_48 = pNVar12;
          if (NI_00 != (NameIndex *)0x0) {
            this_01 = (DWARFUnit *)
                      (pNVar12->Abbrevs).
                      super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                      .TheMap.Buckets;
            if (this_01 == (DWARFUnit *)0x0) {
              __assert_fail("Val && \"isa<> used on a null pointer\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x69,
                            "static bool llvm::isa_impl_cl<llvm::DWARFCompileUnit, const llvm::DWARFUnit *>::doit(const From *) [To = llvm::DWARFCompileUnit, From = const llvm::DWARFUnit *]"
                           );
            }
            if (((this_01->Header).UnitType & 0xfb) == 2) {
              __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x108,
                            "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = llvm::DWARFCompileUnit, Y = llvm::DWARFUnit]"
                           );
            }
            DWARFUnit::extractDIEsIfNeeded(this_01,false);
            pDVar3 = (this_01->DieArray).
                     super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pDVar13 = (this_01->DieArray).
                           super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start; pDVar13 != pDVar3;
                pDVar13 = pDVar13 + 1) {
              local_90 = (undefined1  [8])this_01;
              NTE.StrData.Data.Data = (char *)pDVar13;
              uVar8 = verifyNameIndexCompleteness
                                ((DWARFVerifier *)E.Payload,(DWARFDie *)local_90,NI_00);
              uVar6 = uVar6 + uVar8;
            }
          }
          pNVar12 = (NameIndex *)
                    &(local_48->Abbrevs).
                     super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                     .TheMap.NumEntries;
        } while (pNVar12 !=
                 (NameIndex *)((long)(&pHVar4->AugmentationString + -3) + 8 + (ulong)uVar7 * 8));
      }
    }
  }
  else {
    __n_00 = 0;
    prVar10 = WithColor::error((WithColor *)(E.Payload)->_vptr_ErrorInfoBase,(raw_ostream *)0xbd4a1c
                               ,(StringRef)ZEXT816(0),(bool)in_R8B);
    local_50 = (ulong)local_40 | 1;
    local_40 = (_func_int **)0x0;
    toString_abi_cxx11_((string *)local_90,(llvm *)&local_50,E_00);
    prVar10 = (raw_ostream *)raw_ostream::write(prVar10,local_90._0_4_,NTE.StrData.Data.Data,__n_00)
    ;
    __n = prVar10->OutBufCur;
    if (__n < prVar10->OutBufEnd) {
      prVar10->OutBufCur = __n + 1;
      *__n = '\n';
    }
    else {
      raw_ostream::write(prVar10,10,__buf,(size_t)__n);
    }
    if (local_90 != (undefined1  [8])&NTE.StrData.Data.Length) {
      operator_delete((void *)local_90,NTE.StrData.Data.Length + 1);
    }
    if ((long *)(local_50 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_50 & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)((ulong)local_40 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_40 & 0xfffffffffffffffe) + 8))();
    }
    uVar6 = 1;
  }
LAB_00b10b2e:
  local_100.super_DWARFAcceleratorTable._vptr_DWARFAcceleratorTable = (_func_int **)NTE.EntryOffset;
  operator_delete((void *)CONCAT44(local_100.CUToNameIndex.Buckets._4_4_,
                                   local_100.CUToNameIndex.Buckets._0_4_),
                  ((ulong)local_100.CUToNameIndex._12_8_ >> 0x20) << 4,8);
  SmallVector<llvm::DWARFDebugNames::NameIndex,_0U>::~SmallVector(&local_100.NameIndices);
  DWARFAcceleratorTable::~DWARFAcceleratorTable(&local_100.super_DWARFAcceleratorTable);
  return uVar6;
}

Assistant:

unsigned DWARFVerifier::verifyDebugNames(const DWARFSection &AccelSection,
                                         const DataExtractor &StrData) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), AccelSection,
                                      DCtx.isLittleEndian(), 0);
  DWARFDebugNames AccelTable(AccelSectionData, StrData);

  OS << "Verifying .debug_names...\n";

  // This verifies that we can read individual name indices and their
  // abbreviation tables.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  NumErrors += verifyDebugNamesCULists(AccelTable);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexBuckets(NI, StrData);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexAbbrevs(NI);

  // Don't attempt Entry validation if any of the previous checks found errors
  if (NumErrors > 0)
    return NumErrors;
  for (const auto &NI : AccelTable)
    for (DWARFDebugNames::NameTableEntry NTE : NI)
      NumErrors += verifyNameIndexEntries(NI, NTE);

  if (NumErrors > 0)
    return NumErrors;

  for (const std::unique_ptr<DWARFUnit> &U : DCtx.compile_units()) {
    if (const DWARFDebugNames::NameIndex *NI =
            AccelTable.getCUNameIndex(U->getOffset())) {
      auto *CU = cast<DWARFCompileUnit>(U.get());
      for (const DWARFDebugInfoEntry &Die : CU->dies())
        NumErrors += verifyNameIndexCompleteness(DWARFDie(CU, &Die), *NI);
    }
  }
  return NumErrors;
}